

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O1

err_t rngESHealth2(void)

{
  err_t eVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    eVar1 = rngESTest(*(char **)((long)&PTR_anon_var_dwarf_4b30_0014fd80 + lVar2));
    if (eVar1 == 0) {
      return 0;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 == 8);
  return 0x12f;
}

Assistant:

err_t rngESHealth2()
{
	const char* sources[] = { "trng", "trng2" };
	size_t pos;
	// проверить физические источники
	for (pos = 0; pos < COUNT_OF(sources); ++pos)
		if (rngESTest(sources[pos]) == ERR_OK)
			return ERR_OK;
	// работоспособные источники не найдены
	return ERR_NOT_ENOUGH_ENTROPY;
}